

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.h
# Opt level: O2

void __thiscall imrt::ApertureILS::~ApertureILS(ApertureILS *this)

{
  ~ApertureILS(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ApertureILS() {}